

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAnimationKeyFrames
          (OgreXmlSerializer *this,Animation *anim,VertexAnimationTrack *dest)

{
  pointer *ppTVar1;
  string *psVar2;
  iterator __position;
  int iVar3;
  string *psVar4;
  Logger *this_00;
  runtime_error *this_01;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  TransformKeyFrame local_234;
  float local_208;
  float fStack_204;
  undefined4 uStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  vector<Assimp::Ogre::TransformKeyFrame,std::allocator<Assimp::Ogre::TransformKeyFrame>> *local_1e0
  ;
  long *local_1d8;
  long local_1c8 [2];
  float local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  NextNode_abi_cxx11_(this);
  psVar2 = &this->m_currentNodeName;
  iVar3 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar3 != 0) {
    return;
  }
  local_1e8 = &anim->name;
  local_1e0 = (vector<Assimp::Ogre::TransformKeyFrame,std::allocator<Assimp::Ogre::TransformKeyFrame>>
               *)&dest->transformKeyFrames;
  do {
    TransformKeyFrame::TransformKeyFrame(&local_234);
    local_234.timePos = ReadAttribute<float>(this,"time");
    while( true ) {
      NextNode_abi_cxx11_(this);
      iVar3 = std::__cxx11::string::compare((char *)psVar2);
      if (((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)psVar2), iVar3 != 0)) &&
         (iVar3 = std::__cxx11::string::compare((char *)psVar2), iVar3 != 0)) break;
      iVar3 = std::__cxx11::string::compare((char *)psVar2);
      if (iVar3 == 0) {
        local_234.position.x = ReadAttribute<float>(this,"x");
        local_234.position.y = ReadAttribute<float>(this,"y");
        local_234.position.z = ReadAttribute<float>(this,"z");
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)psVar2);
        if (iVar3 == 0) {
          fVar5 = ReadAttribute<float>(this,"angle");
          psVar4 = NextNode_abi_cxx11_(this);
          iVar3 = std::__cxx11::string::compare((char *)psVar4);
          if (iVar3 != 0) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(local_1a8,"No axis specified for keyframe rotation in animation ",
                           local_1e8);
            std::runtime_error::runtime_error(this_01,(string *)local_1a8);
            *(undefined ***)this_01 = &PTR__runtime_error_0080bf48;
            __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          fVar6 = ReadAttribute<float>(this,"x");
          fStack_204 = ReadAttribute<float>(this,"y");
          local_1f8._4_4_ = extraout_XMM0_Db_00;
          local_1f8._0_4_ = fStack_204;
          uStack_1f0 = extraout_XMM0_Dc;
          uStack_1ec = extraout_XMM0_Dd;
          local_208 = fVar6;
          uStack_200 = extraout_XMM0_Db;
          fStack_1fc = extraout_XMM0_Db_00;
          fVar7 = ReadAttribute<float>(this,"z");
          if (((ABS(fVar6) <= 1e-06) && (ABS((float)local_1f8._0_4_) <= 1e-06)) &&
             (ABS(fVar7) <= 1e-06)) {
            local_208 = 1.0;
            uStack_200 = 0;
            fStack_1fc = fStack_204;
            if ((fVar5 != 0.0) || (NAN(fVar5))) {
              this_00 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[67]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,
                         (char (*) [67])
                         "Found invalid a key frame with a zero rotation axis in animation: ");
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(anim->name)._M_dataplus._M_p,
                         (anim->name)._M_string_length);
              std::__cxx11::stringbuf::str();
              Logger::warn(this_00,(char *)local_1d8);
              if (local_1d8 != local_1c8) {
                operator_delete(local_1d8,local_1c8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
            }
          }
          fVar6 = 1.0 / SQRT(fVar7 * fVar7 + local_208 * local_208 + fStack_204 * fStack_204);
          _local_1f8 = ZEXT416((uint)fVar6);
          local_1b8 = sinf(fVar5 * 0.5);
          local_234.rotation.w = cosf(fVar5 * 0.5);
          local_234.rotation.z = fVar7 * fVar6 * local_1b8;
          local_234.rotation.y = local_1b8 * (float)local_1f8._0_4_ * fStack_204;
          local_234.rotation.x = local_1b8 * (float)local_1f8._0_4_ * local_208;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)psVar2);
          if (iVar3 == 0) {
            local_234.scale.x = ReadAttribute<float>(this,"x");
            local_234.scale.y = ReadAttribute<float>(this,"y");
            local_234.scale.z = ReadAttribute<float>(this,"z");
          }
        }
      }
    }
    __position._M_current =
         (dest->transformKeyFrames).
         super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (dest->transformKeyFrames).
        super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::Ogre::TransformKeyFrame,std::allocator<Assimp::Ogre::TransformKeyFrame>>::
      _M_realloc_insert<Assimp::Ogre::TransformKeyFrame_const&>(local_1e0,__position,&local_234);
    }
    else {
      *(ulong *)&((__position._M_current)->position).z =
           CONCAT44(local_234.scale.x,local_234.position.z);
      ((__position._M_current)->scale).y = local_234.scale.y;
      ((__position._M_current)->scale).z = local_234.scale.z;
      *(ulong *)&((__position._M_current)->rotation).z =
           CONCAT44(local_234.position.x,local_234.rotation.z);
      ((__position._M_current)->position).y = local_234.position.y;
      ((__position._M_current)->position).z = local_234.position.z;
      (__position._M_current)->timePos = local_234.timePos;
      ((__position._M_current)->rotation).w = local_234.rotation.w;
      ((__position._M_current)->rotation).x = local_234.rotation.x;
      ((__position._M_current)->rotation).y = local_234.rotation.y;
      ppTVar1 = &(dest->transformKeyFrames).
                 super__Vector_base<Assimp::Ogre::TransformKeyFrame,_std::allocator<Assimp::Ogre::TransformKeyFrame>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
    }
    iVar3 = std::__cxx11::string::compare((char *)psVar2);
  } while (iVar3 == 0);
  return;
}

Assistant:

void OgreXmlSerializer::ReadAnimationKeyFrames(Animation *anim, VertexAnimationTrack *dest)
{
    const aiVector3D zeroVec(0.f, 0.f, 0.f);

    NextNode();
    while(m_currentNodeName == nnKeyFrame)
    {
        TransformKeyFrame keyframe;
        keyframe.timePos = ReadAttribute<float>("time");

        NextNode();
        while(m_currentNodeName == nnTranslate || m_currentNodeName == nnRotate || m_currentNodeName == nnScale)
        {
            if (m_currentNodeName == nnTranslate)
            {
                keyframe.position.x = ReadAttribute<float>(anX);
                keyframe.position.y = ReadAttribute<float>(anY);
                keyframe.position.z = ReadAttribute<float>(anZ);
            }
            else if (m_currentNodeName == nnRotate)
            {
                float angle = ReadAttribute<float>("angle");

                if (NextNode() != nnAxis) {
                    throw DeadlyImportError("No axis specified for keyframe rotation in animation " + anim->name);
                }

                aiVector3D axis;
                axis.x = ReadAttribute<float>(anX);
                axis.y = ReadAttribute<float>(anY);
                axis.z = ReadAttribute<float>(anZ);
                if (axis.Equal(zeroVec))
                {
                    axis.x = 1.0f;
                    if (angle != 0) {
                        ASSIMP_LOG_WARN_F("Found invalid a key frame with a zero rotation axis in animation: ", anim->name);
                    }
                }
                keyframe.rotation = aiQuaternion(axis, angle);
            }
            else if (m_currentNodeName == nnScale)
            {
                keyframe.scale.x = ReadAttribute<float>(anX);
                keyframe.scale.y = ReadAttribute<float>(anY);
                keyframe.scale.z = ReadAttribute<float>(anZ);
            }

            NextNode();
        }

        dest->transformKeyFrames.push_back(keyframe);
    }
}